

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

void call_init_write(qpdf_data qpdf)

{
  element_type *__args_1;
  shared_ptr<QPDFWriter> local_20;
  qpdf_data local_10;
  qpdf_data qpdf_local;
  
  local_10 = qpdf;
  __args_1 = std::__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       ((__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)qpdf)
  ;
  std::make_shared<QPDFWriter,QPDF&,char_const*&>((QPDF *)&local_20,(char **)__args_1);
  std::shared_ptr<QPDFWriter>::operator=(&local_10->qpdf_writer,&local_20);
  std::shared_ptr<QPDFWriter>::~shared_ptr(&local_20);
  return;
}

Assistant:

static void
call_init_write(qpdf_data qpdf)
{
    qpdf->qpdf_writer = std::make_shared<QPDFWriter>(*(qpdf->qpdf), qpdf->filename);
}